

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

Token * __thiscall Lexer::readToken(Token *__return_storage_ptr__,Lexer *this)

{
  string *this_00;
  int iVar1;
  int iVar2;
  pointer pcVar3;
  byte __rhs;
  int iVar4;
  long *plVar5;
  undefined8 extraout_RAX;
  uint uVar6;
  size_type *psVar7;
  Token token;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  skipWhitespace(this);
  __return_storage_ptr__->type = NullToken;
  __return_storage_ptr__->lineNumber = 0;
  __return_storage_ptr__->columnNumber = 0;
  this_00 = &__return_storage_ptr__->tokenData;
  local_98 = &(__return_storage_ptr__->tokenData).field_2;
  (__return_storage_ptr__->tokenData)._M_dataplus._M_p = (pointer)local_98;
  (__return_storage_ptr__->tokenData)._M_string_length = 0;
  (__return_storage_ptr__->tokenData).field_2._M_local_buf[0] = '\0';
  iVar1 = this->_currentLineNo;
  iVar2 = this->_currentColumnNo;
  __rhs = readChar(this);
  this->_currentColumnNo = this->_currentColumnNo + -1;
  iVar4 = isalpha((int)(char)__rhs);
  if (((iVar4 == 0) && (__rhs != 0x5f)) && (__rhs != 0x2e)) {
    if (__rhs == 0x2d || (int)(char)__rhs - 0x30U < 10) {
      readNumber((Token *)local_c8,this);
      goto LAB_00107e3c;
    }
    uVar6 = __rhs - 0x23;
    if (uVar6 < 0x1e) {
      if ((0x800261U >> (uVar6 & 0x1f) & 1) == 0) {
        if (uVar6 != 0x1d) goto LAB_00107f0e;
        readRegister((Token *)local_c8,this);
      }
      else {
        readDelimiter((Token *)local_c8,this);
      }
      goto LAB_00107e3c;
    }
LAB_00107f0e:
    if (__rhs != 0) {
      local_48 = 0;
      local_40[0] = 0;
      local_50 = local_40;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90._M_dataplus._M_p = (pointer)*plVar5;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_90._M_dataplus._M_p == psVar7) {
        local_90.field_2._M_allocated_capacity = *psVar7;
        local_90.field_2._8_8_ = plVar5[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar7;
      }
      local_90._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                     &local_90,__rhs);
      plVar5 = (long *)std::__cxx11::string::append(local_c8);
      local_70._M_dataplus._M_p = (pointer)*plVar5;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_70._M_dataplus._M_p == psVar7) {
        local_70.field_2._M_allocated_capacity = *psVar7;
        local_70.field_2._8_8_ = plVar5[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar7;
      }
      local_70._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      lexerError(this,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
        operator_delete((void *)local_c8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      pcVar3 = (this_00->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != local_98) {
        operator_delete(pcVar3);
      }
      _Unwind_Resume(extraout_RAX);
    }
    local_c8._0_8_ = (pointer)0x6;
    local_c8._8_4_ = 0;
    local_b8._8_8_ = 0;
    local_a8._M_local_buf[0] = '\0';
    __return_storage_ptr__->columnNumber = 0;
    __return_storage_ptr__->type = LineTerminatorToken;
    __return_storage_ptr__->lineNumber = 0;
    local_b8._M_allocated_capacity = (size_type)&local_a8;
    std::__cxx11::string::operator=((string *)this_00,(string *)(local_c8 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_allocated_capacity == &local_a8) goto LAB_00107e72;
  }
  else {
    readKeywordOrIdentifier((Token *)local_c8,this);
LAB_00107e3c:
    __return_storage_ptr__->columnNumber = local_c8._8_4_;
    __return_storage_ptr__->type = local_c8._0_4_;
    __return_storage_ptr__->lineNumber = local_c8._4_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)(local_c8 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_allocated_capacity == &local_a8) goto LAB_00107e72;
  }
  operator_delete((void *)local_b8._M_allocated_capacity);
LAB_00107e72:
  __return_storage_ptr__->lineNumber = iVar1 + 1;
  __return_storage_ptr__->columnNumber = iVar2 + 1;
  skipWhitespace(this);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::readToken() {
    skipWhitespace();

    Token token{Token::NullToken};

    int lineNo = _currentLineNo + 1;
    int colNo = _currentColumnNo + 1;

    char c = peekChar();

    if(std::isalpha(c) || c == '.' || c == '_') {
        token = readKeywordOrIdentifier();
    } else if(std::isdigit(c) || c == '-') {
        token = readNumber();
    } else {
        switch(c) {
//            case '.':
//                token = readKeyword();
//                break;
            case '@':
                token = readRegister();
                break;
            case '\0':
                token = readLineTerminator();
                break;
            case ',':
            case '(':
            case ')':
            case ':':
            case '#':
                token = readDelimiter();
                break;
            default:
                lexerError(std::string{} + "unexpected character: '" + c + "'");
        }
    }

    token.lineNumber = lineNo;
    token.columnNumber = colNo;

    skipWhitespace();

    return token;
}